

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::Unregister
          (SubjectSetRegister *this,Subject *subject_to_unregister)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  bool bVar4;
  _Self local_48 [3];
  _Self local_30;
  iterator state;
  unique_lock<std::mutex> lck;
  Subject *subject_to_unregister_local;
  SubjectSetRegister *this_local;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&state,&this->mutex_);
  this->modified_ = true;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
       ::find(&this->subject_state_,subject_to_unregister);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
       ::end(&this->subject_state_);
  bVar1 = std::operator==(&local_30,local_48);
  bVar4 = true;
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>
             ::operator->(&local_30);
    iVar2 = SubjectState::GetState(&ppVar3->second);
    bVar4 = iVar2 == 1;
  }
  if (bVar4) {
    ClearSubjectState(this,subject_to_unregister);
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>
             ::operator->(&local_30);
    SubjectState::SetState(&ppVar3->second,0);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&state);
  return;
}

Assistant:

void SubjectSetRegister::Unregister(const Subject& subject_to_unregister)
{
    std::unique_lock<std::mutex> lck(mutex_);
    modified_ = true;

    auto state = subject_state_.find(subject_to_unregister);

    if (state == subject_state_.end() || state->second.GetState() == STATE_NEWLY_SUBSCRIBED)
    {
        ClearSubjectState(subject_to_unregister);
    }
    else
    {
        state->second.SetState(STATE_UNSUBSCRIBED);
    }
}